

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sznet::net::Buffer::ensureWritableBytes(Buffer *this,size_t len)

{
  size_t sVar1;
  size_t len_local;
  Buffer *this_local;
  
  sVar1 = writableBytes(this);
  if (sVar1 < len) {
    makeSpace(this,len);
  }
  sVar1 = writableBytes(this);
  if (len <= sVar1) {
    return;
  }
  __assert_fail("writableBytes() >= len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xc6,"void sznet::net::Buffer::ensureWritableBytes(size_t)");
}

Assistant:

void ensureWritableBytes(size_t len)
	{
		if (writableBytes() < len)
		{
			makeSpace(len);
		}
		assert(writableBytes() >= len);
	}